

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrema.c
# Opt level: O3

size_t find_maximum(uint8_t *array,size_t length)

{
  size_t sVar1;
  size_t sVar2;
  byte bVar3;
  
  if (length == 0) {
    return 0;
  }
  sVar2 = 0;
  bVar3 = 0;
  sVar1 = 0;
  do {
    if (bVar3 < array[sVar2]) {
      bVar3 = array[sVar2];
      sVar1 = sVar2;
    }
    sVar2 = sVar2 + 1;
  } while (length != sVar2);
  return sVar1;
}

Assistant:

size_t find_maximum(const uint8_t* array, const size_t length) {
  size_t res = 0;
  uint8_t max = 0;
  for (size_t n = 0; n < length; n++) {
    if (array[n] > max) {
      max = array[n];
      res = n;
    }
  }
  return res;
}